

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void __thiscall
wasm::debug::copyDebugInfo(wasm::Expression*,wasm::Expression*,wasm::Function*,wasm::Function*)::
Lister::visitExpression(wasm::Expression__(void *this,Expression *curr)

{
  Expression *local_10;
  Expression *curr_local;
  
  local_10 = curr;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0xd8),
             &local_10);
  return;
}

Assistant:

void visitExpression(Expression* curr) { list.push_back(curr); }